

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O3

wchar_t archive_entry_update_pathname_utf8(archive_entry *entry,char *name)

{
  wchar_t wVar1;
  int *piVar2;
  
  wVar1 = archive_mstring_update_utf8(entry->archive,&entry->ae_pathname,name);
  if (wVar1 == L'\0') {
    wVar1 = L'\x01';
  }
  else {
    piVar2 = __errno_location();
    wVar1 = L'\0';
    if (*piVar2 == 0xc) {
      __archive_errx(1,"No memory");
    }
  }
  return wVar1;
}

Assistant:

int
archive_entry_update_pathname_utf8(struct archive_entry *entry, const char *name)
{
	if (archive_mstring_update_utf8(entry->archive,
	    &entry->ae_pathname, name) == 0)
		return (1);
	if (errno == ENOMEM)
		__archive_errx(1, "No memory");
	return (0);
}